

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void rmsub_stride(double *A,double *B,double *C,int rows,int cols,int p,int sA,int sB,int sC)

{
  ulong uVar1;
  ulong uVar2;
  
  while (0xc0 < cols + rows + p) {
    rows = rows / 2;
    cols = cols / 2;
    p = p / 2;
    rmsub_stride(A,B,C,rows,cols,p,sA,sB,sC);
    rmsub_stride(A + cols,B + cols,C + cols,rows,cols,p,sA,sB,sC);
    rmsub_stride(A + rows * sB,B + rows * sC,C + rows * sC,rows,cols,p,sA,sB,sC);
    A = A + rows * sB + cols;
    B = B + rows * sC + cols;
    C = C + rows * sC + cols;
  }
  if (0 < rows) {
    uVar1 = 0;
    do {
      if (0 < cols) {
        uVar2 = 0;
        do {
          C[uVar2] = A[uVar2] - B[uVar2];
          uVar2 = uVar2 + 1;
        } while ((uint)cols != uVar2);
      }
      uVar1 = uVar1 + 1;
      C = C + sC;
      B = B + sB;
      A = A + sA;
    } while (uVar1 != (uint)rows);
  }
  return;
}

Assistant:

void rmsub_stride(double* A, double* B, double* C,int rows,int cols,int p,int sA,int sB,int sC) {
	int i,j,u,v,w;
	if (rows + cols + p <= CUTOFF) {
		for (i = 0; i < rows; ++i) {
			u = i * sC;
			v = i * sA;
			w = i * sB;
			for(j = 0; j < cols;j++) {
				C[j + u] = A[j + v] - B[j + w];
			}
		}
		
	 } else {
		 rows/=2;cols/=2;p/=2;
		 rmsub_stride(A,B,C,rows,cols,p,sA,sB,sC);
		 rmsub_stride(A + cols,B + cols,C + cols,rows,cols,p,sA,sB,sC);
		 rmsub_stride(A + rows *sB,B + rows *sC,C + rows *sC,rows,cols,p,sA,sB,sC);
		 rmsub_stride(A + rows *sB + cols,B + rows *sC + cols,C + rows *sC + cols,rows,cols,p,sA,sB,sC);
	 }
}